

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TagExpressionParser::acceptTag(TagExpressionParser *this,string *tag)

{
  Tag local_40;
  
  Tag::Tag(&local_40,tag,this->m_isNegated);
  TagSet::add(&this->m_currentTagSet,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  this->m_isNegated = false;
  return;
}

Assistant:

virtual void acceptTag( std::string const& tag ) {
            m_currentTagSet.add( Tag( tag, m_isNegated ) );
            m_isNegated = false;
        }